

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestEnd(StreamingListener *this,TestInfo *test_info)

{
  bool bVar1;
  TimeInMillis local_60;
  string local_58;
  string local_38;
  
  bVar1 = TestResult::Passed(&test_info->result_);
  local_60 = (test_info->result_).elapsed_time_;
  StreamableToString<long_long>(&local_38,&local_60);
  String::Format_abi_cxx11_
            (&local_58,"event=TestEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,
             local_38._M_dataplus._M_p);
  Send(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void OnTestEnd(const TestInfo& test_info) {
    Send(String::Format(
        "event=TestEnd&passed=%d&elapsed_time=%sms\n",
        (test_info.result())->Passed(),
        StreamableToString((test_info.result())->elapsed_time()).c_str()));
  }